

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O1

S1Interval __thiscall S1Interval::Union(S1Interval *this,S1Interval *y)

{
  double dVar1;
  double dVar2;
  Vector2_d VVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  double lo;
  double hi;
  bool bVar7;
  S1Interval local_38;
  S2LogMessage local_28;
  
  dVar1 = (y->bounds_).c_[0];
  hi = (y->bounds_).c_[1];
  if ((((dVar1 == 3.141592653589793) && (!NAN(dVar1))) && (hi == -3.141592653589793)) && (!NAN(hi)))
  {
LAB_0019eb24:
    local_38.bounds_.c_[0] = (this->bounds_).c_[0];
    local_38.bounds_.c_[1] = (this->bounds_).c_[1];
    goto LAB_0019ec8c;
  }
  lo = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if (lo <= dVar2) {
    if (lo <= dVar1) {
      bVar4 = dVar1 <= dVar2;
      goto LAB_0019eb79;
    }
  }
  else if ((lo <= dVar1) || (dVar1 <= dVar2)) {
    bVar4 = lo != 3.141592653589793 || dVar2 != -3.141592653589793;
LAB_0019eb79:
    if (bVar4) {
      if (lo <= dVar2) {
        if (lo <= hi) {
          bVar4 = hi <= dVar2;
          goto LAB_0019ed81;
        }
      }
      else if ((lo <= hi) || (hi <= dVar2)) {
        bVar4 = lo != 3.141592653589793 || dVar2 != -3.141592653589793;
LAB_0019ed81:
        if (bVar4) {
          bVar4 = Contains(this,y);
          if (!bVar4) {
            local_38.bounds_.c_[0] = -3.141592653589793;
            local_38.bounds_.c_[1] = 3.141592653589793;
            goto LAB_0019ec8c;
          }
          goto LAB_0019eb24;
        }
      }
      bVar4 = false;
      if ((ABS(hi) <= 3.141592653589793) && (bVar4 = false, ABS(lo) <= 3.141592653589793)) {
        bVar7 = hi == 3.141592653589793 || lo != -3.141592653589793;
        bVar4 = lo == 3.141592653589793 && bVar7;
        if (hi != -3.141592653589793) {
          bVar4 = bVar7;
        }
        if (NAN(hi)) {
          bVar4 = bVar7;
        }
      }
      local_38.bounds_.c_[0] = lo;
      local_38.bounds_.c_[1] = hi;
      if (bVar4) goto LAB_0019ec8c;
      S2LogMessage::S2LogMessage
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                 ,0xe4,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_28.stream_,"Check failed: is_valid() ",0x19);
      goto LAB_0019eedc;
    }
  }
  if (lo <= dVar2) {
    if (lo <= hi) {
      bVar4 = hi <= dVar2;
      goto LAB_0019ec05;
    }
  }
  else if ((lo <= hi) || (hi <= dVar2)) {
    bVar4 = dVar2 != -3.141592653589793 || lo != 3.141592653589793;
LAB_0019ec05:
    if (bVar4) {
      bVar4 = false;
      if ((ABS(dVar1) <= 3.141592653589793) && (bVar4 = false, ABS(dVar2) <= 3.141592653589793)) {
        if (((dVar1 != -3.141592653589793) || (NAN(dVar1))) ||
           ((dVar2 == 3.141592653589793 && (!NAN(dVar2))))) {
          if ((dVar2 != -3.141592653589793) || (NAN(dVar2))) {
            bVar4 = true;
          }
          else {
            bVar4 = dVar1 == 3.141592653589793;
          }
        }
        else {
          bVar4 = false;
        }
      }
      local_38.bounds_.c_[0] = dVar1;
      local_38.bounds_.c_[1] = dVar2;
      if (!bVar4) {
        S2LogMessage::S2LogMessage
                  (&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_28.stream_,"Check failed: is_valid() ",0x19);
LAB_0019eedc:
        abort();
      }
      goto LAB_0019ec8c;
    }
  }
  if ((((lo != 3.141592653589793) || (NAN(lo))) || (dVar2 != -3.141592653589793)) || (NAN(dVar2))) {
    if (dVar1 <= hi) {
      if (dVar1 <= lo) {
        bVar4 = lo <= hi;
        goto LAB_0019ece3;
      }
    }
    else if ((dVar1 <= lo) || (lo <= hi)) {
      bVar4 = dVar1 != 3.141592653589793 || hi != -3.141592653589793;
LAB_0019ece3:
      if (bVar4) goto LAB_0019ec83;
    }
    uVar5 = -(ulong)(lo - hi < 0.0);
    uVar6 = -(ulong)(dVar1 - dVar2 < 0.0);
    if ((double)(~uVar5 & (ulong)(lo - hi) |
                (ulong)((lo + 3.141592653589793) - (hi + -3.141592653589793)) & uVar5) <
        (double)(~uVar6 & (ulong)(dVar1 - dVar2) |
                (ulong)((dVar1 + 3.141592653589793) - (dVar2 + -3.141592653589793)) & uVar6)) {
      lo = dVar1;
      hi = dVar2;
    }
    S1Interval(&local_38,lo,hi,ARGS_CHECKED);
  }
  else {
LAB_0019ec83:
    local_38.bounds_.c_[0] = (y->bounds_).c_[0];
    local_38.bounds_.c_[1] = (y->bounds_).c_[1];
  }
LAB_0019ec8c:
  VVar3.c_[1] = local_38.bounds_.c_[1];
  VVar3.c_[0] = local_38.bounds_.c_[0];
  return (Vector2_d)(Vector2_d)VVar3.c_;
}

Assistant:

S1Interval S1Interval::Union(const S1Interval& y) const {
  // The y.is_full() case is handled correctly in all cases by the code
  // below, but can follow three separate code paths depending on whether
  // this interval is inverted, is non-inverted but contains Pi, or neither.

  if (y.is_empty()) return *this;
  if (FastContains(y.lo())) {
    if (FastContains(y.hi())) {
      // Either this interval contains y, or the union of the two
      // intervals is the Full() interval.
      if (Contains(y)) return *this;  // is_full() code path
      return Full();
    }
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
  if (FastContains(y.hi())) return S1Interval(y.lo(), hi(), ARGS_CHECKED);

  // This interval contains neither endpoint of y.  This means that either y
  // contains all of this interval, or the two intervals are disjoint.
  if (is_empty() || y.FastContains(lo())) return y;

  // Check which pair of endpoints are closer together.
  double dlo = PositiveDistance(y.hi(), lo());
  double dhi = PositiveDistance(hi(), y.lo());
  if (dlo < dhi) {
    return S1Interval(y.lo(), hi(), ARGS_CHECKED);
  } else {
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
}